

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

Limit __thiscall
google::protobuf::io::CodedInputStream::ReadLengthAndPushLimit(CodedInputStream *this)

{
  bool bVar1;
  Limit LVar2;
  uint32_t byte_limit;
  uint32_t length;
  uint32_t local_c;
  
  bVar1 = ReadVarint32(this,&local_c);
  byte_limit = 0;
  if (bVar1) {
    byte_limit = local_c;
  }
  LVar2 = PushLimit(this,byte_limit);
  return LVar2;
}

Assistant:

CodedInputStream::Limit CodedInputStream::ReadLengthAndPushLimit() {
  uint32_t length;
  return PushLimit(ReadVarint32(&length) ? length : 0);
}